

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct-utils.h
# Opt level: O3

StructValues<wasm::PossibleConstantValues> * __thiscall
wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>::operator[]
          (StructValuesMap<wasm::PossibleConstantValues> *this,HeapType type)

{
  HeapTypeKind HVar1;
  Struct *pSVar2;
  __hashtable *__h;
  vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_> *this_00;
  pair<std::__detail::_Node_iterator<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_false,_true>,_bool>
  pVar3;
  uintptr_t local_68;
  vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_> local_60;
  vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_> local_48;
  HeapType local_28;
  HeapType type_local;
  
  local_28.id = type.id;
  HVar1 = HeapType::getKind(&local_28);
  if (HVar1 == Struct) {
    local_48.
    super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48.
    super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48.
    super__Vector_base<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_68 = local_28.id;
    std::vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>::vector
              (&local_60,&local_48);
    pVar3 = std::
            _Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>,std::allocator<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::
            _M_emplace<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>>
                      ((_Hashtable<wasm::HeapType,std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>,std::allocator<std::pair<wasm::HeapType_const,wasm::StructUtils::StructValues<wasm::PossibleConstantValues>>>,std::__detail::_Select1st,std::equal_to<wasm::HeapType>,std::hash<wasm::HeapType>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)this,&local_68);
    std::vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>::
    ~vector(&local_60);
    std::vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>::
    ~vector(&local_48);
    this_00 = (vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_> *
              )((long)pVar3.first.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_true>
                      ._M_cur.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::StructUtils::StructValues<wasm::PossibleConstantValues>_>,_true>
               + 0x10);
    if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      pSVar2 = HeapType::getStruct(&local_28);
      std::vector<wasm::PossibleConstantValues,_std::allocator<wasm::PossibleConstantValues>_>::
      resize(this_00,(long)(pSVar2->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)(pSVar2->fields).
                           super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
                           super__Vector_impl_data._M_start >> 4);
    }
    return (StructValues<wasm::PossibleConstantValues> *)this_00;
  }
  __assert_fail("type.isStruct()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/struct-utils.h"
                ,0x3a,
                "StructValues<T> &wasm::StructUtils::StructValuesMap<wasm::PossibleConstantValues>::operator[](HeapType) [T = wasm::PossibleConstantValues]"
               );
}

Assistant:

StructValues<T>& operator[](HeapType type) {
    assert(type.isStruct());
    auto inserted = this->insert({type, {}});
    auto& values = inserted.first->second;
    if (inserted.second) {
      values.resize(type.getStruct().fields.size());
    }
    return values;
  }